

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O1

int ClipSegmentToLine(ClipVertex *vOut,ClipVertex *vIn,cbtVector3 *normal,cbtScalar offset)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  int *piVar9;
  float fVar10;
  
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(normal->m_floats[1] * (vIn->v).m_floats[1])),
                           ZEXT416((uint)normal->m_floats[0]),ZEXT416((uint)(vIn->v).m_floats[0]));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)normal->m_floats[2]),
                           ZEXT416((uint)(vIn->v).m_floats[2]));
  fVar3 = auVar5._0_4_ - offset;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(normal->m_floats[1] * vIn[1].v.m_floats[1])),
                           ZEXT416((uint)normal->m_floats[0]),ZEXT416((uint)vIn[1].v.m_floats[0]));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)normal->m_floats[2]),
                           ZEXT416((uint)vIn[1].v.m_floats[2]));
  fVar4 = auVar5._0_4_ - offset;
  if (fVar3 <= 0.0) {
    vOut->id = vIn->id;
    uVar6 = *(undefined8 *)((vIn->v).m_floats + 2);
    *(undefined8 *)(vOut->v).m_floats = *(undefined8 *)(vIn->v).m_floats;
    *(undefined8 *)((vOut->v).m_floats + 2) = uVar6;
  }
  uVar7 = (uint)(fVar3 <= 0.0);
  uVar8 = uVar7;
  if (fVar4 <= 0.0) {
    uVar8 = uVar7 + 1;
    vOut[uVar7].id = vIn[1].id;
    uVar6 = *(undefined8 *)(vIn[1].v.m_floats + 2);
    *(undefined8 *)vOut[uVar7].v.m_floats = *(undefined8 *)vIn[1].v.m_floats;
    *(undefined8 *)(vOut[uVar7].v.m_floats + 2) = uVar6;
  }
  if (fVar3 * fVar4 < 0.0) {
    fVar10 = fVar3 / (fVar3 - fVar4);
    fVar4 = (vIn->v).m_floats[0];
    fVar1 = (vIn->v).m_floats[1];
    fVar2 = (vIn->v).m_floats[2];
    auVar5 = vinsertps_avx(ZEXT416((uint)(fVar4 + fVar10 * (vIn[1].v.m_floats[0] - fVar4))),
                           ZEXT416((uint)(fVar1 + fVar10 * (vIn[1].v.m_floats[1] - fVar1))),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)(fVar2 + fVar10 * (vIn[1].v.m_floats[2] - fVar2))),
                           0x28);
    *(undefined1 (*) [16])vOut[uVar8].v.m_floats = auVar5;
    piVar9 = &vIn->id;
    if (fVar3 <= 0.0) {
      piVar9 = &vIn[1].id;
    }
    vOut[uVar8].id = *piVar9;
    uVar8 = uVar8 + 1;
  }
  return uVar8;
}

Assistant:

SIMD_FORCE_INLINE cbtScalar dot(const cbtVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return m_floats[0] * v.m_floats[0] +
			   m_floats[1] * v.m_floats[1] +
			   m_floats[2] * v.m_floats[2];
#endif
	}